

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::ChangeTraceConfig
          (ConsumerEndpointImpl *this,TraceConfig *cfg)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (this->tracing_session_id_ != 0) {
    TracingServiceImpl::ChangeTraceConfig(this->service_,this,cfg);
    return;
  }
  pcVar1 = "/";
  do {
    pcVar3 = pcVar1 + 2;
    pcVar1 = pcVar1 + 1;
  } while (*pcVar3 != '\0');
  pcVar3 = "";
  do {
    pcVar2 = pcVar3 + 1;
    pcVar3 = pcVar3 + 1;
  } while (*pcVar2 != '\0');
  do {
    pcVar2 = pcVar1;
    if (pcVar2 + 1 <
        "workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
       ) break;
    pcVar1 = pcVar2 + -1;
  } while ((pcVar3 <= pcVar2) || (*pcVar2 != '/'));
  base::LogMessage(kLogInfo,pcVar2 + 1,0xe8a3,
                   "Consumer called ChangeTraceConfig() but tracing was not active");
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::ChangeTraceConfig(
    const TraceConfig& cfg) {
  if (!tracing_session_id_) {
    PERFETTO_LOG(
        "Consumer called ChangeTraceConfig() but tracing was "
        "not active");
    return;
  }
  service_->ChangeTraceConfig(this, cfg);
}